

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cast.h
# Opt level: O2

ptr<Value> __thiscall Cast::evaluate(Cast *this,Environment *env)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  size_type sVar2;
  int iVar3;
  undefined4 extraout_var;
  ThrowPacket *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  ptr<Value> pVar4;
  ptr<Value> value;
  Expression local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_50 [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  (*(code *)**(undefined8 **)(env->symbols)._M_h._M_bucket_count)(&value);
  switch((int)(env->symbols)._M_h._M_element_count) {
  case 1:
    (*((value.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_Member).
      _vptr_Member[2])(&local_58);
    std::make_shared<String,std::__cxx11::string&>(&local_38);
    sVar2 = local_38._M_string_length;
    local_38._M_string_length = 0;
    (this->super_UnaryOperator).super_Expression._vptr_Expression =
         (_func_int **)local_38._M_dataplus._M_p;
    (this->super_UnaryOperator).expression.
    super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)sVar2;
    local_38._M_dataplus._M_p = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_38._M_string_length);
    std::__cxx11::string::~string((string *)&local_58);
    goto LAB_0011809e;
  case 2:
    (*((value.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_Member).
      _vptr_Member[4])();
    local_38._M_dataplus._M_p = (pointer)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    std::make_shared<Double,double&>((double *)&local_58);
    break;
  case 3:
    iVar3 = (*((value.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_Member).
              _vptr_Member[3])();
    local_38._M_dataplus._M_p = (pointer)CONCAT44(extraout_var,iVar3);
    std::make_shared<Integer,long_long&>((longlong *)&local_58);
    break;
  case 4:
    iVar3 = (*((value.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_Member).
              _vptr_Member[5])();
    local_38._M_dataplus._M_p._0_1_ = (char)iVar3;
    std::make_shared<Boolean,bool&>((bool *)&local_58);
    break;
  case 5:
    (*((value.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_Member).
      _vptr_Member[6])(&local_58);
    break;
  case 6:
    (*((value.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_Member).
      _vptr_Member[7])(&local_58);
    break;
  default:
    this_00 = (ThrowPacket *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"Could not cast value",(allocator<char> *)&local_38);
    ExceptionObjects::bad_cast((string *)&local_38.field_2);
    ThrowPacket::ThrowPacket(this_00,(ptr<Value> *)&local_38.field_2);
    __cxa_throw(this_00,&ThrowPacket::typeinfo,CarrierPacket::~CarrierPacket);
  }
  _Var1._M_pi = a_Stack_50[0]._M_pi;
  a_Stack_50[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_UnaryOperator).super_Expression._vptr_Expression = local_58._vptr_Expression;
  (this->super_UnaryOperator).expression.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)_Var1._M_pi;
  local_58._vptr_Expression = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_50);
LAB_0011809e:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&value.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  pVar4.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi
  ;
  pVar4.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Value>)pVar4.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Value> evaluate(Environment *env) override {
        ptr<Value> value = expression -> evaluate(env);

        if(type == Type::Object)
            return value -> asObject();
        else if(type == Type::Array)
            return value -> asArray();
        else if(type == Type::String)
            return make<String>(value -> asString());
        else if(type == Type::Double)
            return make<Double>(value -> asDouble());
        else if(type == Type::Integer)
            return make<Integer>(value -> asInteger());
        else if(type == Type::Boolean)
            return make<Boolean>(value -> asBoolean());

        throw ThrowPacket(ExceptionObjects::bad_cast("Could not cast value"));
    }